

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall cursespp::App::CheckShowOverlay(App *this)

{
  element_type *peVar1;
  IWindow *pIVar2;
  ILayoutPtr newTopLayout;
  ILayoutPtr top;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  OverlayStack::Top((OverlayStack *)&top);
  peVar1 = (this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (top.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr != peVar1) {
    if (peVar1 != (element_type *)0x0) {
      (*(peVar1->super_IDisplayable)._vptr_IDisplayable[3])(&peVar1->super_IDisplayable);
    }
    std::__shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2> *)&this->state,
               &top.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>);
    if (top.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pIVar2 = (IWindow *)0x0;
    }
    else {
      pIVar2 = (IWindow *)
               __dynamic_cast(top.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,&ILayout::typeinfo,&IWindow::typeinfo,0xfffffffffffffffe);
    }
    (this->state).overlayWindow = pIVar2;
    WindowState::ActiveLayout((WindowState *)&newTopLayout);
    if (newTopLayout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (*((newTopLayout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_IWindowGroup)._vptr_IWindowGroup[0x12])();
      (*((newTopLayout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_IDisplayable)._vptr_IDisplayable[2])
                (&(newTopLayout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_IDisplayable);
      (*((newTopLayout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_IOrderable)._vptr_IOrderable[2])
                (&(newTopLayout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_IOrderable);
      (*((newTopLayout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_IWindowGroup)._vptr_IWindowGroup[6])(local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&newTopLayout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&top.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void App::CheckShowOverlay() {
    ILayoutPtr top = overlays.Top();

    if (top != this->state.overlay) {
        if (this->state.overlay) {
            this->state.overlay->Hide();
        }

        this->state.overlay = top;

        this->state.overlayWindow =
            top ? dynamic_cast<IWindow*>(top.get()) : nullptr;

        ILayoutPtr newTopLayout = this->state.ActiveLayout();
        if (newTopLayout) {
            newTopLayout->Layout();
            newTopLayout->Show();
            newTopLayout->BringToTop();
            newTopLayout->FocusFirst();
        }
    }
}